

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::MajorityActionPolicy::Action
          (MajorityActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppSVar5;
  reference pvVar6;
  int local_74;
  value_type vStack_70;
  int a;
  double bestWeight;
  int bestAction;
  ACT_TYPE action;
  State *particle;
  int i;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> frequencies;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  MajorityActionPolicy *this_local;
  
  frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)history;
  iVar3 = (*((this->super_DefaultPolicy).super_ScenarioLowerBound.model_)->_vptr_DSPOMDP[5])();
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,(long)iVar3,&local_41);
  std::allocator<double>::~allocator(&local_41);
  particle._0_4_ = 0;
  while( true ) {
    sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar4 <= (ulong)(long)(int)particle) break;
    ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)(int)particle);
    pSVar2 = *ppSVar5;
    iVar3 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSVar2);
    dVar1 = pSVar2->weight;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_40,(long)iVar3);
    *pvVar6 = dVar1 + *pvVar6;
    particle._0_4_ = (int)particle + 1;
  }
  bestWeight._0_4_ = 0;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,0);
  vStack_70 = *pvVar6;
  local_74 = 1;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_40);
    if (sVar4 <= (ulong)(long)local_74) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_40,(long)local_74);
    if (vStack_70 < *pvVar6) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_40,(long)local_74);
      vStack_70 = *pvVar6;
      bestWeight._0_4_ = local_74;
    }
    local_74 = local_74 + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return bestWeight._0_4_;
}

Assistant:

ACT_TYPE MajorityActionPolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<double> frequencies(model_->NumActions());

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		ACT_TYPE action = policy_.GetAction(*particle);
		frequencies[action] += particle->weight;
	}

	int bestAction = 0;
	double bestWeight = frequencies[0];
	for (int a = 1; a < frequencies.size(); a++) {
		if (bestWeight < frequencies[a]) {
			bestWeight = frequencies[a];
			bestAction = a;
		}
	}

	return bestAction;
}